

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O1

duckdb_state duckdb_connect(duckdb_database database,duckdb_connection *out)

{
  Connection *this;
  type database_00;
  
  if (out != (duckdb_connection *)0x0 && database != (duckdb_database)0x0) {
    this = (Connection *)operator_new(0x20);
    database_00 = duckdb::shared_ptr<duckdb::DuckDB,_true>::operator*
                            ((shared_ptr<duckdb::DuckDB,_true> *)database);
    duckdb::Connection::Connection(this,database_00);
    *out = (duckdb_connection)this;
  }
  return (uint)(out == (duckdb_connection *)0x0 || database == (duckdb_database)0x0);
}

Assistant:

duckdb_state duckdb_connect(duckdb_database database, duckdb_connection *out) {
	if (!database || !out) {
		return DuckDBError;
	}

	auto wrapper = reinterpret_cast<DatabaseWrapper *>(database);
	Connection *connection;
	try {
		connection = new Connection(*wrapper->database);
	} catch (...) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP

	*out = reinterpret_cast<duckdb_connection>(connection);
	return DuckDBSuccess;
}